

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<true> * __thiscall
DefaultState<true>::Ignore(DefaultState<true> *this,Context<true> *ctx,SizeType length)

{
  byte bVar1;
  Ch *pCVar2;
  ulong uVar3;
  undefined8 in_RAX;
  stringstream *psVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  byte *pbVar9;
  undefined8 uStack_18;
  
  pCVar2 = ctx->stream->src_;
  uVar3 = (ulong)length;
  pbVar9 = (byte *)(pCVar2 + uVar3 + 2);
  uStack_18 = in_RAX;
  if ((pbVar9 < ctx->stream_end) && (*pbVar9 == 0x3a)) {
    iVar6 = 0;
    iVar8 = 0;
    pbVar9 = (byte *)(pCVar2 + uVar3 + 3);
    do {
      bVar1 = *pbVar9;
      if (bVar1 < 0x5d) {
        if (bVar1 < 0x2c) {
          if (bVar1 == 0x22) {
            do {
              for (; bVar1 = pbVar9[1], bVar1 == 0x5c; pbVar9 = pbVar9 + 2) {
              }
              if (bVar1 == 0) goto LAB_001b7483;
              pbVar9 = pbVar9 + 1;
            } while (bVar1 != 0x22);
          }
          else if (bVar1 == 0) goto LAB_001b7483;
        }
        else if (bVar1 == 0x2c) {
          if (iVar8 == 0 && iVar6 == 0) goto LAB_001b7460;
        }
        else if (bVar1 == 0x5b) {
          iVar6 = iVar6 + 1;
        }
      }
      else if (bVar1 == 0x5d) {
        if (iVar8 == 0 && iVar6 == 0) goto LAB_001b7460;
        iVar6 = iVar6 + -1;
      }
      else if (bVar1 == 0x7b) {
        iVar8 = iVar8 + 1;
      }
      else if (bVar1 == 0x7d) {
        if (iVar8 == 0 && iVar6 == 0) goto LAB_001b7460;
        iVar8 = iVar8 + -1;
      }
      pbVar9 = pbVar9 + 1;
    } while( true );
  }
  psVar4 = Context<true>::error_abi_cxx11_(ctx);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(psVar4 + 0x10),"Expected \':\' found \'",0x14);
  uStack_18 = CONCAT17(*pbVar9,(undefined7)uStack_18);
  psVar4 = (stringstream *)
           std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(psVar4 + 0x10),(char *)((long)&uStack_18 + 7),1);
  pcVar7 = "\'";
  lVar5 = 1;
LAB_001b749b:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar4,pcVar7,lVar5);
  return (BaseState<true> *)0x0;
LAB_001b7460:
  if (pCVar2 + uVar3 + 3 < ctx->stream_end) {
    pCVar2[uVar3 + 3] = '0';
    memset(pCVar2 + uVar3 + 4,0x20,(long)pbVar9 - (long)(pCVar2 + uVar3 + 4));
    return &(ctx->ignore_state).super_BaseState<true>;
  }
LAB_001b7483:
  psVar4 = Context<true>::error_abi_cxx11_(ctx);
  psVar4 = psVar4 + 0x10;
  pcVar7 = "Found EOF";
  lVar5 = 9;
  goto LAB_001b749b;
}

Assistant:

BaseState<audit>* Ignore(Context<audit>& ctx, rapidjson::SizeType length)
  {
    // fast ignore
    // skip key + \0 + "
    char* head = ctx.stream->src_ + length + 2;
    if (head >= ctx.stream_end || *head != ':')
    {
      ctx.error() << "Expected ':' found '" << *head << "'";
      return nullptr;
    }
    head++;

    // scan for ,}
    // support { { ... } }
    int depth = 0, sq_depth = 0;
    bool stop = false;
    while (!stop)
    {
      switch (*head)
      {
        case '\0':
          ctx.error() << "Found EOF";
          return nullptr;
        case '"':
        {
          // skip strings
          bool stopInner = false;
          while (!stopInner)
          {
            head++;
            switch (*head)
            {
              case '\0':
                ctx.error() << "Found EOF";
                return nullptr;
              case '\\':
                head++;
                break;
              case '"':
                stopInner = true;
                break;
            }
          }
          break;
        }
        case '{':
          depth++;
          break;
        case '}':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          else
            depth--;
          break;
        case '[':
          sq_depth++;
          break;
        case ']':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          else
            sq_depth--;
          break;
        case ',':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          break;
      }
      head++;
    }

    // skip key + \0 + ":
    char* value = ctx.stream->src_ + length + 3;
    if (value >= ctx.stream_end)
    {
      ctx.error() << "Found EOF";
      return nullptr;
    }

    *value = '0';
    value++;
    memset(value, ' ', head - value - 1);

    return &ctx.ignore_state;
  }